

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack14_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *in;
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1000004));
  *out = uVar1 & 0x3fff;
  uVar3 = *(ulong *)(in + 1);
  out[1] = uVar1 >> 0xe & 0x3fff;
  uVar2 = in[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar7 = vpsllvd_avx2(auVar8,_DAT_001a2e10);
  auVar5._8_4_ = 0x3ff0;
  auVar5._0_8_ = 0x3f0000003ff0;
  auVar5._12_4_ = 0x3f00;
  auVar5 = vpandq_avx512vl(auVar7,auVar5);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar8,ZEXT416(uVar1));
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_001ad240);
  auVar6 = vpmovzxdq_avx(auVar5);
  auVar6 = vpor_avx(auVar7,auVar6);
  auVar4._8_4_ = 0x3fff;
  auVar4._0_8_ = 0x3fff00003fff;
  auVar4._12_4_ = 0x3fff;
  auVar7 = vpandd_avx512vl(auVar7,auVar4);
  auVar6 = vpblendd_avx2(auVar6,auVar7,10);
  *(undefined1 (*) [16])(out + 2) = auVar6;
  out[6] = (uint)(uVar3 >> 0x34) | (uVar2 & 3) << 0xc;
  out[7] = uVar2 >> 2 & 0x3fff;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack14_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;

  return in + 1;
}